

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulative.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  double dVar1;
  value_type vVar2;
  int iVar3;
  istream *piVar4;
  ostream *poVar5;
  size_t sVar6;
  double dVar7;
  undefined1 auVar8 [16];
  char separator;
  double y;
  double x;
  regression<double> filter;
  ifstream file;
  char local_2aa;
  char local_2a9;
  value_type local_2a8;
  value_type local_2a0;
  regression<double> local_298;
  double local_238 [4];
  byte abStack_218 [488];
  
  if (argc == 2) {
    local_298.y_moment.super_basic_moment<double,_(trial::online::with)1>.member.mean = 0.0;
    local_298.y_moment.super_basic_moment<double,_(trial::online::with)1>.member.count = 0;
    local_298.x_moment.super_basic_moment<double,_(trial::online::with)1>.member.count = 0;
    local_298.x_moment.sum.variance = 0.0;
    local_298.co_moment.center = 0.0;
    local_298.x_moment.super_basic_moment<double,_(trial::online::with)1>.member.mean = 0.0;
    local_298.co_moment.y_center.member.mean = 0.0;
    local_298.co_moment.y_center.member.count = 0;
    local_298.co_moment.x_center.member.mean = 0.0;
    local_298.co_moment.x_center.member.count = 0;
    local_298.y_moment.sum.variance = 0.0;
    std::ifstream::ifstream(local_238,argv[1],_S_in);
    if ((abStack_218[*(long *)((long)local_238[0] + -0x18)] & 5) == 0) {
      do {
        piVar4 = std::istream::_M_extract<double>(local_238);
        piVar4 = std::operator>>(piVar4,&local_2a9);
        std::istream::_M_extract<double>((double *)piVar4);
        trial::online::cumulative::regression<double>::push(&local_298,local_2a0,local_2a8);
        poVar5 = std::ostream::_M_insert<double>(local_2a0);
        local_2aa = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2aa,1);
        poVar5 = std::ostream::_M_insert<double>(local_2a8);
        local_2aa = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2aa,1);
        dVar7 = local_298.x_moment.sum.variance /
                (((double)CONCAT44(0x45300000,
                                   (int)(local_298.x_moment.
                                         super_basic_moment<double,_(trial::online::with)1>.member.
                                         count >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,
                                  (int)local_298.x_moment.
                                       super_basic_moment<double,_(trial::online::with)1>.member.
                                       count) - 4503599627370496.0));
        dVar1 = 0.0;
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          if (local_298.co_moment.x_center.member.count != local_298.co_moment.y_center.member.count
             ) {
            __assert_fail("x_center.size() == y_center.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/include/trial/online/cumulative/detail/comoment.ipp"
                          ,0x2c,
                          "size_type trial::online::cumulative::basic_comoment<double, trial::online::with::variance>::size() const [T = double, Moment = trial::online::with::variance]"
                         );
          }
          auVar8._8_4_ = (int)(local_298.co_moment.x_center.member.count >> 0x20);
          auVar8._0_8_ = local_298.co_moment.x_center.member.count;
          auVar8._12_4_ = 0x45300000;
          if (local_298.co_moment.x_center.member.count != 0) {
            dVar1 = local_298.co_moment.center /
                    ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_298.co_moment.x_center.member.count) -
                    4503599627370496.0));
          }
          dVar1 = dVar1 / dVar7;
        }
        poVar5 = std::ostream::_M_insert<double>(dVar1);
        local_2aa = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2aa,1);
        vVar2 = trial::online::cumulative::regression<double>::at(&local_298,0.0);
        poVar5 = std::ostream::_M_insert<double>(vVar2);
        local_2aa = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2aa,1);
      } while ((abStack_218[*(long *)((long)local_238[0] + -0x18)] & 5) == 0);
    }
    std::ifstream::~ifstream(local_238);
    iVar3 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1050a8);
    }
    else {
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," <file>",7);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc != 2)
    {
        std::cerr << "Usage: " << argv[0] << " <file>" << std::endl;
        return 1;
    }

    cumulative::regression<double> filter;

    double x;
    double y;
    char separator;

    std::ifstream file(argv[1]);
    while (file)
    {
        file >> x >> separator >> y;
        filter.push(x, y);
        std::cout << x << ',' << y << ',' << filter.slope() << ',' << filter.at(0) << '\n';
    }
    return 0;
}